

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::struct_reader
          (string *__return_storage_ptr__,t_st_generator *this,t_struct *tstruct,string *clsName)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  pointer pptVar5;
  string desc;
  string val;
  string found;
  string name;
  ostringstream out;
  string sStack_338;
  t_struct *local_318;
  string local_310;
  string *local_2f0;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  local_318 = tstruct;
  local_2f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  temp_name_abi_cxx11_(&local_2a8,this);
  temp_name_abi_cxx11_(&local_2e8,this);
  temp_name_abi_cxx11_(&local_288,this);
  if (clsName->_M_string_length == 0) {
    (*(local_318->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::_M_assign((string *)clsName);
  }
  poVar3 = std::operator<<(&local_1a8,"[|");
  poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  poVar3 = std::operator<<(poVar3,"|");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string((string *)&local_248,(string *)clsName);
  t_generator::capitalize(&sStack_338,(t_generator *)this,&local_248);
  bVar2 = std::operator==(&sStack_338,"TResult");
  if (bVar2) {
    psVar4 = &local_1c8;
    std::__cxx11::string::string((string *)psVar4,(string *)clsName);
    t_generator::capitalize(&local_268,(t_generator *)this,psVar4);
  }
  else {
    psVar4 = &local_1e8;
    std::__cxx11::string::string((string *)psVar4,(string *)clsName);
    prefix(&local_268,this,psVar4);
  }
  std::__cxx11::string::~string((string *)psVar4);
  std::__cxx11::string::~string((string *)&sStack_338);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_abi_cxx11_(&sStack_338,(t_generator *)this);
  poVar3 = std::operator<<(&local_1a8,(string *)&sStack_338);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  poVar3 = std::operator<<(poVar3," := ");
  poVar3 = std::operator<<(poVar3,(string *)&local_268);
  poVar3 = std::operator<<(poVar3," new.");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_338);
  t_generator::indent_abi_cxx11_(&sStack_338,(t_generator *)this);
  poVar3 = std::operator<<(&local_1a8,(string *)&sStack_338);
  poVar3 = std::operator<<(poVar3,"iprot readStructBegin.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_310);
  poVar3 = std::operator<<(poVar3,"[");
  poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
  poVar3 = std::operator<<(poVar3," := iprot readFieldBegin.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2c8);
  poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
  poVar3 = std::operator<<(poVar3," type = TType stop] whileFalse: [|");
  poVar3 = std::operator<<(poVar3,(string *)&local_288);
  poVar3 = std::operator<<(poVar3,"|");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&sStack_338);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar5 = (local_318->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (local_318->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    t_generator::indent_abi_cxx11_(&sStack_338,(t_generator *)this);
    poVar3 = std::operator<<(&local_1a8,(string *)&sStack_338);
    poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
    poVar3 = std::operator<<(poVar3," id = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar5)->key_);
    poVar3 = std::operator<<(poVar3," ifTrue: [");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_338);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&sStack_338,(t_generator *)this);
    poVar3 = std::operator<<(&local_1a8,(string *)&sStack_338);
    poVar3 = std::operator<<(poVar3,(string *)&local_288);
    poVar3 = std::operator<<(poVar3," := true.");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_310);
    poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
    poVar3 = std::operator<<(poVar3," ");
    std::__cxx11::string::string((string *)&local_228,(string *)&(*pptVar5)->name_);
    t_generator::camelcase(&local_2c8,(t_generator *)this,&local_228);
    poVar3 = std::operator<<(poVar3,(string *)&local_2c8);
    poVar3 = std::operator<<(poVar3,": ");
    read_val_abi_cxx11_(&local_208,this,(*pptVar5)->type_);
    std::operator<<(poVar3,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&sStack_338);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar3 = std::operator<<(&local_1a8,"].");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_abi_cxx11_(&sStack_338,(t_generator *)this);
  poVar3 = std::operator<<(&local_1a8,(string *)&sStack_338);
  poVar3 = std::operator<<(poVar3,(string *)&local_288);
  poVar3 = std::operator<<(poVar3," ifNil: [iprot skip: ");
  poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
  poVar3 = std::operator<<(poVar3," type]].");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_338);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_338,(t_generator *)this);
  poVar3 = std::operator<<(&local_1a8,(string *)&sStack_338);
  poVar3 = std::operator<<(poVar3,"oprot readStructEnd.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_310);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  std::operator<<(poVar3,"] value");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&sStack_338);
  psVar4 = local_2f0;
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return psVar4;
}

Assistant:

string t_st_generator::struct_reader(t_struct* tstruct, string clsName = "") {
  std::ostringstream out;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator fld_iter;
  string val = temp_name();
  string desc = temp_name();
  string found = temp_name();

  if (clsName.size() == 0) {
    clsName = tstruct->get_name();
  }

  out << "[|" << desc << " " << val << "|" << endl;
  indent_up();

  // This is nasty, but without it we'll break things by prefixing TResult.
  string name = ((capitalize(clsName) == "TResult") ? capitalize(clsName) : prefix(clsName));
  out << indent() << val << " := " << name << " new." << endl;

  out << indent() << "iprot readStructBegin." << endl << indent() << "[" << desc
      << " := iprot readFieldBegin." << endl << indent() << desc
      << " type = TType stop] whileFalse: [|" << found << "|" << endl;
  indent_up();

  for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
    out << indent() << desc << " id = " << (*fld_iter)->get_key() << " ifTrue: [" << endl;
    indent_up();

    out << indent() << found << " := true." << endl << indent() << val << " "
        << camelcase((*fld_iter)->get_name()) << ": " << read_val((*fld_iter)->get_type());
    indent_down();

    out << "]." << endl;
  }

  out << indent() << found << " ifNil: [iprot skip: " << desc << " type]]." << endl;
  indent_down();

  out << indent() << "oprot readStructEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}